

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QMdiSubWindow::showShaded(QMdiSubWindow *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiSubWindowPrivate *this_00;
  Data *pDVar5;
  QWidgetData *pQVar6;
  Representation RVar7;
  Representation RVar8;
  Representation RVar9;
  bool bVar10;
  QWidget *pQVar11;
  Data *pDVar12;
  QSize QVar13;
  short sVar14;
  
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) ||
     ((this_00->isShadeRequestFromMinimizeMode == false && (this_00->isShadeMode != false)))) {
    return;
  }
  this_00->isMaximizeMode = false;
  pQVar11 = QApplication::focusWidget();
  if ((pQVar11 != (QWidget *)0x0) &&
     (((pDVar5 = (this_00->restoreFocusWidget).wp.d, pDVar5 == (Data *)0x0 ||
       (*(int *)(pDVar5 + 4) == 0)) || ((this_00->restoreFocusWidget).wp.value == (QObject *)0x0))))
  {
    bVar10 = QWidget::isAncestorOf(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8,pQVar11);
    if (bVar10) {
      pDVar12 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar11->super_QObject);
      pDVar5 = (this_00->restoreFocusWidget).wp.d;
      (this_00->restoreFocusWidget).wp.d = pDVar12;
      (this_00->restoreFocusWidget).wp.value = &pQVar11->super_QObject;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar5 = *(int *)pDVar5 + -1;
        UNLOCK();
        if (*(int *)pDVar5 == 0) {
          operator_delete(pDVar5);
        }
      }
    }
  }
  if (this_00->isShadeRequestFromMinimizeMode == false) {
    this_00->isShadeMode = true;
    QMdiSubWindowPrivate::ensureWindowState(this_00,WindowMinimized);
  }
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
  bVar10 = QWidget::hasFocus(&this->super_QWidget);
  if (!bVar10) {
    pQVar11 = QApplication::focusWidget();
    bVar10 = QWidget::isAncestorOf(&this->super_QWidget,pQVar11);
    if (!bVar10) goto LAB_0045565b;
  }
  QMdiSubWindowPrivate::ensureWindowState(this_00,WindowActive);
LAB_0045565b:
  QMdiSubWindowPrivate::setSizeGripVisible(this_00,false);
  if ((((this_00->restoreSize).wd.m_i < 0) || ((this_00->restoreSize).ht.m_i < 0)) ||
     (this_00->isShadeMode == true)) {
    pQVar6 = (this->super_QWidget).data;
    RVar7.m_i = (pQVar6->crect).y1.m_i;
    RVar8.m_i = (pQVar6->crect).x2.m_i;
    RVar9.m_i = (pQVar6->crect).y2.m_i;
    (this_00->oldGeometry).x1 = (Representation)(pQVar6->crect).x1.m_i;
    (this_00->oldGeometry).y1 = (Representation)RVar7.m_i;
    (this_00->oldGeometry).x2 = (Representation)RVar8.m_i;
    (this_00->oldGeometry).y2 = (Representation)RVar9.m_i;
    uVar1 = (this_00->oldGeometry).x2;
    uVar3 = (this_00->oldGeometry).y2;
    uVar2 = (this_00->oldGeometry).x1;
    uVar4 = (this_00->oldGeometry).y1;
    QVar13.wd.m_i = (uVar1 - uVar2) + 1;
    QVar13.ht.m_i = (uVar3 - uVar4) + 1;
    this_00->restoreSize = QVar13;
  }
  sVar14 = (short)((this->super_QWidget).data)->widget_attributes;
  if (sVar14 < 0) {
    (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,0);
  }
  QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
  QVar13 = QWidget::minimumSize(&this->super_QWidget);
  if (QVar13 != (QSize)0x0) {
    QVar13 = QWidget::minimumSize(&this->super_QWidget);
    this_00->userMinimumSize = QVar13;
    QWidget::setMinimumSize
              (&this->super_QWidget,(this_00->internalMinimumSize).wd.m_i,
               (this_00->internalMinimumSize).ht.m_i);
  }
  QWidget::resize(&this->super_QWidget,&this_00->internalMinimumSize);
  pDVar5 = (this_00->baseWidget).wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (((this_00->baseWidget).wp.value != (QObject *)0x0 &&
      (((*(byte *)(*(long *)((this_00->baseWidget).wp.value + 0x20) + 10) & 1) == 0 &&
       (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)))))) {
    QWidget::hide((QWidget *)(this_00->baseWidget).wp.value);
    this_00->isWidgetHiddenByUs = true;
  }
  if (sVar14 < 0) {
    (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,1);
  }
  QMdiSubWindowPrivate::setFocusWidget(this_00);
  this_00->resizeEnabled = false;
  this_00->moveEnabled = true;
  QMdiSubWindowPrivate::updateDirtyRegions(this_00);
  QMdiSubWindowPrivate::updateMask(this_00);
  QMdiSubWindowPrivate::setEnabled(this_00,MinimizeAction,false);
  QMdiSubWindowPrivate::setEnabled(this_00,ResizeAction,this_00->resizeEnabled);
  QMdiSubWindowPrivate::setEnabled(this_00,MaximizeAction,true);
  QMdiSubWindowPrivate::setEnabled(this_00,RestoreAction,true);
  QMdiSubWindowPrivate::setEnabled(this_00,MoveAction,this_00->moveEnabled);
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }